

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_super_seeding(torrent *this,bool on)

{
  peer_connection *this_00;
  bool bVar1;
  reference pppVar2;
  piece_index_t local_40;
  piece_index_t local_3c;
  peer_connection *local_38;
  peer_connection *pc;
  peer_iterator __end2;
  peer_iterator __begin2;
  torrent *__range2;
  bool on_local;
  torrent *this_local;
  
  if (on != (bool)((byte)this->field_0x5cc >> 3 & 1)) {
    this->field_0x5cc = this->field_0x5cc & 0xf7 | on << 3;
    set_need_save_resume(this,(resume_data_flags_t)0x40);
    state_updated(this);
    if (((byte)this->field_0x5cc >> 3 & 1) == 0) {
      __end2 = begin(this);
      pc = (peer_connection *)end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                         *)&pc), bVar1) {
        pppVar2 = __gnu_cxx::
                  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                  ::operator*(&__end2);
        this_00 = *pppVar2;
        local_38 = this_00;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_3c,-1);
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_40,-1);
        peer_connection::superseed_piece(this_00,local_3c,local_40);
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
        ::operator++(&__end2);
      }
    }
  }
  return;
}

Assistant:

void torrent::set_super_seeding(bool const on)
	{
		if (on == m_super_seeding) return;

		m_super_seeding = on;
		set_need_save_resume(torrent_handle::if_state_changed);
		state_updated();

		if (m_super_seeding) return;

		// disable super seeding for all peers
		for (auto* pc : *this)
		{
			pc->superseed_piece(piece_index_t(-1), piece_index_t(-1));
		}
	}